

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_shapes.cxx
# Opt level: O0

void __thiscall xray_re::xr_scene_shapes::save_v12(xr_scene_shapes *this,xr_ini_writer *w)

{
  xr_custom_object_vec *this_00;
  void *__buf;
  xr_scene *this_01;
  size_t in_RCX;
  xr_ini_writer *w_local;
  xr_scene_shapes *this_local;
  
  xr_ini_writer::open_section(w,"main");
  this_00 = xr_scene_objects::objects(&this->super_xr_scene_objects);
  __buf = (void *)std::
                  vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                  ::size(this_00);
  xr_ini_writer::write(w,0x2e29b5,__buf,in_RCX);
  xr_ini_writer::write(w,0x2e4e39,(void *)0x0,in_RCX);
  xr_ini_writer::close_section(w);
  this_01 = xr_scene_part::scene((xr_scene_part *)this);
  xr_scene::write_revision(this_01,w,true);
  xr_scene_objects::save_v12(&this->super_xr_scene_objects,w);
  return;
}

Assistant:

void xr_scene_shapes::save_v12(xr_ini_writer* w) const
{
	w->open_section("main");
	w->write("objects_count", this->objects().size());
	w->write("version", 0);
	w->close_section();

	scene().write_revision(w);

	xr_scene_objects::save_v12(w);
}